

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# streams.cpp
# Opt level: O0

void __thiscall
AutoFile::AutoFile(AutoFile *this,FILE *file,vector<std::byte,_std::allocator<std::byte>_> *data_xor
                  )

{
  long lVar1;
  bool bVar2;
  optional<long> *this_00;
  undefined8 in_RSI;
  undefined8 *in_RDI;
  long in_FS_OFFSET;
  long pos;
  AutoFile *in_stack_ffffffffffffff88;
  long *in_stack_ffffffffffffff90;
  undefined8 local_18;
  undefined8 local_10;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  *in_RDI = in_RSI;
  std::vector<std::byte,_std::allocator<std::byte>_>::vector
            ((vector<std::byte,_std::allocator<std::byte>_> *)in_stack_ffffffffffffff88,
             (vector<std::byte,_std::allocator<std::byte>_> *)0xffd4c2);
  std::optional<long>::optional((optional<long> *)in_stack_ffffffffffffff88);
  bVar2 = IsNull(in_stack_ffffffffffffff88);
  if ((!bVar2) && (this_00 = (optional<long> *)ftell((FILE *)*in_RDI), -1 < (long)this_00)) {
    std::optional<long>::optional<long_&,_true>(this_00,in_stack_ffffffffffffff90);
    in_RDI[4] = local_18;
    in_RDI[5] = local_10;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

AutoFile::AutoFile(std::FILE* file, std::vector<std::byte> data_xor)
    : m_file{file}, m_xor{std::move(data_xor)}
{
    if (!IsNull()) {
        auto pos{std::ftell(m_file)};
        if (pos >= 0) m_position = pos;
    }
}